

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Return * __thiscall Parser::return_stmt(Parser *this)

{
  uint uVar1;
  int iVar2;
  Return *pRVar3;
  ulong uVar4;
  pointer pTVar5;
  Expr *pEVar6;
  ulong uVar7;
  bool bVar8;
  
  pRVar3 = (Return *)operator_new(0x18);
  (pRVar3->super_Stmt).super_Node.kind = Return;
  (pRVar3->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__Return_00117cc0;
  pRVar3->expr = (Expr *)0x0;
  iVar2 = this->tok_i;
  uVar1 = iVar2 + 1;
  this->tok_i = uVar1;
  if (iVar2 < -1) {
LAB_0010f4d1:
    pTVar5 = &this->eof;
  }
  else {
    uVar4 = (ulong)uVar1;
    pTVar5 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
            -0x3333333333333333;
    if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_0010f4d1;
    pTVar5 = pTVar5 + uVar4;
  }
  this->tok = pTVar5;
  if (pTVar5->kind == Eof) {
    bVar8 = true;
    goto LAB_0010f55e;
  }
  if ((pTVar5->kind == Punctuator) && (pTVar5->i == 0x3b)) {
    bVar8 = false;
  }
  else {
    pEVar6 = additive_expression(this);
    pRVar3->expr = pEVar6;
    bVar8 = pEVar6 == (Expr *)0x0;
  }
  if ((this->tok->kind != Punctuator) || (this->tok->i != 0x3b)) goto LAB_0010f55e;
  iVar2 = this->tok_i;
  uVar1 = iVar2 + 1;
  this->tok_i = uVar1;
  if (iVar2 < -1) {
LAB_0010f556:
    pTVar5 = &this->eof;
  }
  else {
    uVar4 = (ulong)uVar1;
    pTVar5 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
            -0x3333333333333333;
    if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_0010f556;
    pTVar5 = pTVar5 + uVar4;
  }
  this->tok = pTVar5;
LAB_0010f55e:
  if (bVar8) {
    error<char_const(&)[49]>
              (this,(char (*) [49])"expecting \';\' or expression for return statement");
  }
  return pRVar3;
}

Assistant:

Return* Parser::return_stmt()
{
  auto r = std::make_unique<Return>();
  bool err = false;

  if (next_token().kind != TokenKind::Eof) {
    if (!is_punctuator(';')) {
      r->expr = expression();
      if (!r->expr)
        err = true;
    }
    if (is_punctuator(';')) {
      next_token(); // Skip ';', return with expression
    }
  }
  else
    err = true;

  if (err)
    error("expecting ';' or expression for return statement");

  return r.release();
}